

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O2

Index Eigen::internal::partial_lu_impl<double,_0,_int,_-1>::unblocked_lu
                (MatrixTypeRef *lu,int *row_transpositions,int *nb_transpositions)

{
  PointerType pdVar1;
  long lVar2;
  long lVar3;
  VariableAndFixedInt<_1> n;
  long i;
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
  *pDVar4;
  Type *pTVar5;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_score_coeff_op<double>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>,_1,1,false>const>>
  *pDVar6;
  undefined8 *puVar7;
  VariableAndFixedInt<_1> n_00;
  long n_01;
  bool bVar8;
  byte bVar9;
  Scalar SVar10;
  long local_2b0;
  Index row_of_biggest_in_col;
  int *local_2a0;
  long local_298;
  int *local_290;
  long local_288;
  Type *local_280;
  Type local_278;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_score_coeff_op<double>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>,_1,1,false>const>>
  local_210 [104];
  undefined8 local_1a8 [13];
  Type local_140;
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>
  local_108 [56];
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
  local_d0;
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
  local_98 [104];
  
  bVar9 = 0;
  n_01 = (lu->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value;
  lVar2 = (lu->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value;
  local_288 = n_01;
  if (lVar2 < n_01) {
    local_288 = lVar2;
  }
  *nb_transpositions = 0;
  local_298 = n_01 + -1;
  i = 0;
  if (local_288 < 1) {
    local_288 = i;
  }
  n_00.m_value = (int)lVar2;
  local_2b0 = -1;
  local_2a0 = nb_transpositions;
  local_290 = row_transpositions;
  for (; n_00.m_value = n_00.m_value + -1, local_288 != i; i = i + 1) {
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
             *)&local_278,lu,i);
    DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>_>
    ::tail<long>((Type *)local_98,
                 (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>_>
                  *)&local_278,n_01);
    pDVar4 = local_98;
    pDVar6 = local_210;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)pDVar6 = *(undefined8 *)pDVar4;
      pDVar4 = pDVar4 + (ulong)bVar9 * -0x10 + 8;
      pDVar6 = pDVar6 + (ulong)bVar9 * -0x10 + 8;
    }
    SVar10 = DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_score_coeff_op<double>,Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>,-1,1,false>const>>
             ::maxCoeff<0,long>(local_210,&row_of_biggest_in_col);
    lVar2 = row_of_biggest_in_col + i;
    local_290[i] = (int)lVar2;
    n.m_value = (int)(n_01 + -1);
    if ((SVar10 != 0.0) || (NAN(SVar10))) {
      bVar8 = row_of_biggest_in_col != 0;
      row_of_biggest_in_col = lVar2;
      if (bVar8) {
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>
        ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>
                 *)local_210,lu,i);
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>
        ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>
                 *)local_98,lu,row_of_biggest_in_col);
        DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,1,-1,false>>
        ::
        swap<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>
                  ((DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>
                    *)local_210,local_98);
        *local_2a0 = *local_2a0 + 1;
      }
      lVar2 = (lu->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      pdVar1 = (lu->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
               *)local_98,lu,i);
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>>
      ::tail<Eigen::internal::VariableAndFixedInt<_1>>((Type *)local_210,local_98,n);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_-1,_1,_false>_>
      ::operator/=((DenseBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>
                    *)local_210,pdVar1 + lVar2 * i + i);
    }
    else {
      row_of_biggest_in_col = lVar2;
      if (local_2b0 == -1) {
        local_2b0 = i;
      }
    }
    if (i < local_298) {
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>
      ::Block(&local_d0,lu,i);
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,1,true>>
      ::tail<Eigen::internal::VariableAndFixedInt<_1>>((Type *)local_98,&local_d0,n);
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>
               *)local_108,lu,i);
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,1,-1,false>>
      ::tail<Eigen::internal::VariableAndFixedInt<_1>>(&local_278,local_108,n_00);
      lVar2 = 0xd;
      pDVar4 = local_98;
      pDVar6 = local_210;
      for (lVar3 = lVar2; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)pDVar6 = *(undefined8 *)pDVar4;
        pDVar4 = pDVar4 + (ulong)bVar9 * -0x10 + 8;
        pDVar6 = pDVar6 + ((ulong)bVar9 * -2 + 1) * 8;
      }
      pTVar5 = &local_278;
      puVar7 = local_1a8;
      for (; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar7 = (pTVar5->
                  super_Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>
                  ).
                  super_BlockImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_0>
                  .m_data;
        pTVar5 = (Type *)((long)pTVar5 + (ulong)bVar9 * -0x10 + 8);
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      }
      DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
      bottomRightCorner<Eigen::internal::VariableAndFixedInt<_1>,Eigen::internal::VariableAndFixedInt<_1>>
                (&local_140,lu,n,n_00);
      local_280 = &local_140;
      NoAlias<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>,Eigen::MatrixBase>
      ::operator-=((NoAlias<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::MatrixBase>
                    *)&local_280,
                   (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>,_Eigen::Block<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_1,__1,_false>,_0>_>
                    *)local_210);
    }
    n_01 = n_01 + -1;
  }
  return local_2b0;
}

Assistant:

static Index unblocked_lu(MatrixTypeRef& lu, PivIndex* row_transpositions, PivIndex& nb_transpositions)
  {
    typedef scalar_score_coeff_op<Scalar> Scoring;
    typedef typename Scoring::result_type Score;
    const Index rows = lu.rows();
    const Index cols = lu.cols();
    const Index size = (std::min)(rows,cols);
    // For small compile-time matrices it is worth processing the last row separately:
    //  speedup: +100% for 2x2, +10% for others.
    const Index endk = UnBlockedAtCompileTime ? size-1 : size;
    nb_transpositions = 0;
    Index first_zero_pivot = -1;
    for(Index k = 0; k < endk; ++k)
    {
      int rrows = internal::convert_index<int>(rows-k-1);
      int rcols = internal::convert_index<int>(cols-k-1);

      Index row_of_biggest_in_col;
      Score biggest_in_corner
        = lu.col(k).tail(rows-k).unaryExpr(Scoring()).maxCoeff(&row_of_biggest_in_col);
      row_of_biggest_in_col += k;

      row_transpositions[k] = PivIndex(row_of_biggest_in_col);

      if(biggest_in_corner != Score(0))
      {
        if(k != row_of_biggest_in_col)
        {
          lu.row(k).swap(lu.row(row_of_biggest_in_col));
          ++nb_transpositions;
        }

        lu.col(k).tail(fix<RRows>(rrows)) /= lu.coeff(k,k);
      }
      else if(first_zero_pivot==-1)
      {
        // the pivot is exactly zero, we record the index of the first pivot which is exactly 0,
        // and continue the factorization such we still have A = PLU
        first_zero_pivot = k;
      }

      if(k<rows-1)
        lu.bottomRightCorner(fix<RRows>(rrows),fix<RCols>(rcols)).noalias() -= lu.col(k).tail(fix<RRows>(rrows)) * lu.row(k).tail(fix<RCols>(rcols));
    }

    // special handling of the last entry
    if(UnBlockedAtCompileTime)
    {
      Index k = endk;
      row_transpositions[k] = PivIndex(k);
      if (Scoring()(lu(k, k)) == Score(0) && first_zero_pivot == -1)
        first_zero_pivot = k;
    }

    return first_zero_pivot;
  }